

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_gamma.c
# Opt level: O3

uint32_t SharpYuvGammaToLinear(uint16_t v,int bit_depth,SharpYuvTransferFunctionType transfer_type)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  float fVar5;
  double dVar6;
  float fVar7;
  double __y;
  
  bVar3 = (byte)bit_depth;
  if (transfer_type == kSharpYuvTransferFunctionSrgb) {
    if (bit_depth < 10) {
      return kGammaToLinearTabS[(int)((uint)v << (10 - bVar3 & 0x1f))];
    }
    bVar2 = (byte)(bit_depth + -10);
    uVar4 = (uint)(v >> (bVar2 & 0x1f));
    iVar1 = 1 << (bVar3 - 0xb & 0x1f);
    if (bit_depth + -10 == 0) {
      iVar1 = 0;
    }
    return (iVar1 + (kGammaToLinearTabS[(ulong)uVar4 + 1] - kGammaToLinearTabS[uVar4]) *
                    ((uint)v - (uVar4 << (bVar2 & 0x1f))) >> (bVar2 & 0x1f)) +
           kGammaToLinearTabS[uVar4];
  }
  fVar7 = 0.0;
  if (0x11 < transfer_type - kSharpYuvTransferFunctionBt709) goto switchD_001b35f9_caseD_2;
  uVar4 = (uint)v;
  fVar5 = (float)uVar4 / (float)~(-1 << (bVar3 & 0x1f));
  fVar7 = 0.0;
  switch(transfer_type) {
  default:
    if (0.08124286 <= fVar5) {
      fVar7 = 1.0;
      if (fVar5 < 1.0) goto LAB_001b36e3;
    }
    else {
LAB_001b3608:
      fVar7 = fVar5 / 4.5;
    }
    break;
  case 2:
  case 3:
  case kSharpYuvTransferFunctionSrgb:
    break;
  case kSharpYuvTransferFunctionBt470M:
    fVar7 = 1.0;
    if (fVar5 <= 1.0) {
      fVar7 = fVar5;
    }
    dVar6 = (double)fVar7;
    __y = 2.200000047683716;
    goto LAB_001b37ec;
  case kSharpYuvTransferFunctionBt470Bg:
    fVar7 = 1.0;
    if (fVar5 <= 1.0) {
      fVar7 = fVar5;
    }
    dVar6 = (double)fVar7;
    __y = 2.799999952316284;
    goto LAB_001b37ec;
  case kSharpYuvTransferFunctionSmpte240:
    if (fVar5 < 0.09128634) {
      fVar7 = fVar5 * 0.25;
    }
    else {
      fVar7 = 1.0;
      if (fVar5 < 1.0) {
        fVar7 = (fVar5 + 0.1115722) / 1.1115721;
        goto LAB_001b36f3;
      }
    }
    break;
  case kSharpYuvTransferFunctionLinear:
    goto switchD_001b35f9_caseD_8;
  case kSharpYuvTransferFunctionLog100:
    if (0.0 < fVar5) {
      if (1.0 <= fVar5) {
        fVar5 = 1.0;
      }
      fVar7 = fVar5 + -1.0 + fVar5 + -1.0;
LAB_001b37dd:
      __y = (double)fVar7;
      dVar6 = 10.0;
      goto LAB_001b37ec;
    }
    fVar7 = 0.005;
    break;
  case kSharpYuvTransferFunctionLog100_Sqrt10:
    if (0.0 < fVar5) {
      if (1.0 <= fVar5) {
        fVar5 = 1.0;
      }
      fVar7 = (fVar5 + -1.0) * 2.5;
      goto LAB_001b37dd;
    }
    fVar7 = 0.0015811388;
    break;
  case kSharpYuvTransferFunctionIec61966:
    if (fVar5 < 0.08124286) goto LAB_001b3608;
LAB_001b36e3:
    fVar7 = (fVar5 + 0.09929682) / 1.0992968;
LAB_001b36f3:
    dVar6 = (double)fVar7;
    __y = 2.222222328186035;
LAB_001b37ec:
    dVar6 = pow(dVar6,__y);
    fVar7 = (float)dVar6;
    break;
  case kSharpYuvTransferFunctionSmpte2084:
    fVar7 = 0.0;
    if (0.0 < fVar5) {
      dVar6 = pow((double)fVar5,0.012683313339948654);
      fVar7 = (float)dVar6 + -0.8359375;
      if (fVar7 <= 0.0) {
        fVar7 = 0.0;
      }
      fVar5 = (float)dVar6 * -18.6875 + 18.851562;
      if (fVar5 <= 1.1754944e-38) {
        fVar5 = 1.1754944e-38;
      }
      dVar6 = (double)(fVar7 / fVar5);
      __y = 6.27258825302124;
      goto LAB_001b37ec;
    }
    break;
  case kSharpYuvTransferFunctionSmpte428:
    if (fVar5 <= 0.0) {
      fVar5 = 0.0;
    }
    dVar6 = pow((double)fVar5,2.5999999046325684);
    fVar7 = (float)dVar6 / 0.9165553;
    break;
  case kSharpYuvTransferFunctionHlg:
    if (fVar5 <= 0.5) {
      fVar7 = fVar5 * fVar5 * 0.33333334;
    }
    else {
      fVar7 = expf((fVar5 + -0.5599107) / 0.17883277);
      fVar7 = (fVar7 + 0.28466892) / 12.0;
    }
    dVar6 = pow((double)fVar7,1.2000000476837158);
    fVar7 = (float)dVar6;
  }
switchD_001b35f9_caseD_2:
  fVar7 = fVar7 * 65535.0;
  if (0.0 <= fVar7) {
    fVar7 = floorf(fVar7 + 0.5);
  }
  else {
    fVar7 = ceilf(fVar7 + -0.5);
  }
  uVar4 = (uint)(long)fVar7;
switchD_001b35f9_caseD_8:
  return uVar4;
}

Assistant:

uint32_t SharpYuvGammaToLinear(uint16_t v, int bit_depth,
                               SharpYuvTransferFunctionType transfer_type) {
  float v_float, linear;
  if (transfer_type == kSharpYuvTransferFunctionSrgb) {
    return ToLinearSrgb(v, bit_depth);
  }
  v_float = (float)v / ((1 << bit_depth) - 1);
  switch (transfer_type) {
    case kSharpYuvTransferFunctionBt709:
    case kSharpYuvTransferFunctionBt601:
    case kSharpYuvTransferFunctionBt2020_10Bit:
    case kSharpYuvTransferFunctionBt2020_12Bit:
      linear = ToLinear709(v_float);
      break;
    case kSharpYuvTransferFunctionBt470M:
      linear = ToLinear470M(v_float);
      break;
    case kSharpYuvTransferFunctionBt470Bg:
      linear = ToLinear470Bg(v_float);
      break;
    case kSharpYuvTransferFunctionSmpte240:
      linear = ToLinearSmpte240(v_float);
      break;
    case kSharpYuvTransferFunctionLinear:
      return v;
    case kSharpYuvTransferFunctionLog100:
      linear = ToLinearLog100(v_float);
      break;
    case kSharpYuvTransferFunctionLog100_Sqrt10:
      linear = ToLinearLog100Sqrt10(v_float);
      break;
    case kSharpYuvTransferFunctionIec61966:
      linear = ToLinearIec61966(v_float);
      break;
    case kSharpYuvTransferFunctionBt1361:
      linear = ToLinearBt1361(v_float);
      break;
    case kSharpYuvTransferFunctionSmpte2084:
      linear = ToLinearPq(v_float);
      break;
    case kSharpYuvTransferFunctionSmpte428:
      linear = ToLinearSmpte428(v_float);
      break;
    case kSharpYuvTransferFunctionHlg:
      linear = ToLinearHlg(v_float);
      break;
    default:
      assert(0);
      linear = 0;
      break;
  }
  return (uint32_t)Roundf(linear * ((1 << 16) - 1));
}